

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * valueToText(sqlite3_value *pVal,u8 enc)

{
  int iVar1;
  u8 enc_local;
  sqlite3_value *pVal_local;
  
  if ((pVal->flags & 0x12) == 0) {
    sqlite3VdbeMemStringify(pVal,enc,'\0');
  }
  else {
    if (((pVal->flags & 0x4000) != 0) && (iVar1 = sqlite3VdbeMemExpandBlob(pVal), iVar1 != 0)) {
      return (void *)0x0;
    }
    pVal->flags = pVal->flags | 2;
    if (pVal->enc != (enc & 0xf7)) {
      sqlite3VdbeChangeEncoding(pVal,enc & 0xfffffff7);
    }
    if ((((enc & 8) != 0) && (((uint)pVal->z & 1) == 1)) &&
       (iVar1 = sqlite3VdbeMemMakeWriteable(pVal), iVar1 != 0)) {
      return (void *)0x0;
    }
    sqlite3VdbeMemNulTerminate(pVal);
  }
  if (pVal->enc == (enc & 0xf7)) {
    pVal_local = (sqlite3_value *)pVal->z;
  }
  else {
    pVal_local = (sqlite3_value *)0x0;
  }
  return pVal_local;
}

Assistant:

static SQLITE_NOINLINE const void *valueToText(sqlite3_value* pVal, u8 enc){
  assert( pVal!=0 );
  assert( pVal->db==0 || sqlite3_mutex_held(pVal->db->mutex) );
  assert( (enc&3)==(enc&~SQLITE_UTF16_ALIGNED) );
  assert( !sqlite3VdbeMemIsRowSet(pVal) );
  assert( (pVal->flags & (MEM_Null))==0 );
  if( pVal->flags & (MEM_Blob|MEM_Str) ){
    if( ExpandBlob(pVal) ) return 0;
    pVal->flags |= MEM_Str;
    if( pVal->enc != (enc & ~SQLITE_UTF16_ALIGNED) ){
      sqlite3VdbeChangeEncoding(pVal, enc & ~SQLITE_UTF16_ALIGNED);
    }
    if( (enc & SQLITE_UTF16_ALIGNED)!=0 && 1==(1&SQLITE_PTR_TO_INT(pVal->z)) ){
      assert( (pVal->flags & (MEM_Ephem|MEM_Static))!=0 );
      if( sqlite3VdbeMemMakeWriteable(pVal)!=SQLITE_OK ){
        return 0;
      }
    }
    sqlite3VdbeMemNulTerminate(pVal); /* IMP: R-31275-44060 */
  }else{
    sqlite3VdbeMemStringify(pVal, enc, 0);
    assert( 0==(1&SQLITE_PTR_TO_INT(pVal->z)) );
  }
  assert(pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) || pVal->db==0
              || pVal->db->mallocFailed );
  if( pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) ){
    assert( sqlite3VdbeMemConsistentDualRep(pVal) );
    return pVal->z;
  }else{
    return 0;
  }
}